

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O0

double __thiscall
TwoStageDynamicBayesianNetwork::GetYProbability
          (TwoStageDynamicBayesianNetwork *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *X,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *A,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Y)

{
  pointer puVar1;
  TwoStageDynamicBayesianNetwork *pTVar2;
  Index IVar3;
  size_type sVar4;
  size_type sVar5;
  undefined8 uVar6;
  Scope *pSVar7;
  const_reference pvVar8;
  const_reference ppCVar9;
  allocator_type *in_RCX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  TwoStageDynamicBayesianNetwork *pTVar10;
  double p_y;
  Index yVal;
  Index iiI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> Y_restr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> A_restr;
  vector<unsigned_int,_std::allocator<unsigned_int>_> X_restr;
  Index y;
  double p;
  size_t nrSF;
  Index in_stack_fffffffffffffe9c;
  TwoStageDynamicBayesianNetwork *in_stack_fffffffffffffea0;
  allocator_type *in_stack_fffffffffffffeb0;
  Scope *in_stack_fffffffffffffeb8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  E *in_stack_fffffffffffffed0;
  TwoStageDynamicBayesianNetwork *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  value_type in_stack_ffffffffffffff54;
  Index in_stack_ffffffffffffff5c;
  TwoStageDynamicBayesianNetwork *in_stack_ffffffffffffff60;
  uint local_44;
  TwoStageDynamicBayesianNetwork *local_40;
  
  sVar4 = (**(code **)(*(long *)(in_RDI->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_start + 400))();
  sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RCX);
  if (sVar5 == sVar4) {
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RSI);
    if (sVar5 == sVar4) {
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDX);
      puVar1 = (in_RDI->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar5 = (**(code **)(*(long *)((long)puVar1 + *(long *)(*(long *)puVar1 + -0x40)) + 0x10))
                        ((long)puVar1 + *(long *)(*(long *)puVar1 + -0x40));
      if (sVar4 != sVar5) {
        uVar6 = __cxa_allocate_exception(0x28);
        E::E(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        __cxa_throw(uVar6,&E::typeinfo,E::~E);
      }
      pTVar10 = (TwoStageDynamicBayesianNetwork *)0x3ff0000000000000;
      local_40 = (TwoStageDynamicBayesianNetwork *)0x3ff0000000000000;
      local_44 = 0;
      while( true ) {
        sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RCX);
        if (sVar4 <= local_44) break;
        pSVar7 = GetXSoI_Y(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&pSVar7->super_SDT);
        std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0xaf2b90);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8,
                   in_stack_fffffffffffffeb0);
        std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0xaf2bb9);
        GetXSoI_Y(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
        IndexTools::RestrictIndividualIndicesToScope<unsigned_int>
                  (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffeb0)
        ;
        pSVar7 = GetASoI_Y(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&pSVar7->super_SDT);
        std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0xaf2c36);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8,
                   in_stack_fffffffffffffeb0);
        std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0xaf2c5c);
        GetASoI_Y(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
        IndexTools::RestrictIndividualIndicesToScope<unsigned_int>
                  (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffeb0)
        ;
        pSVar7 = GetYSoI_Y(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
        in_stack_fffffffffffffec0 =
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&pSVar7->super_SDT);
        std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0xaf2cd9);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8,
                   in_stack_fffffffffffffeb0);
        std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0xaf2cff);
        in_stack_fffffffffffffeb0 = in_RCX;
        in_stack_fffffffffffffeb8 = GetYSoI_Y(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
        IndexTools::RestrictIndividualIndicesToScope<unsigned_int>
                  (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffeb0)
        ;
        IVar3 = IndividualToJointYiiIndices
                          (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           in_stack_ffffffffffffff48,in_RDI);
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RCX,
                            (ulong)local_44);
        in_stack_ffffffffffffff54 = *pvVar8;
        ppCVar9 = std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::
                  operator[]((vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>
                              *)&in_RDI[0x1a].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_44);
        (*(*ppCVar9)->_vptr_CPDDiscreteInterface[2])
                  (*ppCVar9,(ulong)in_stack_ffffffffffffff54,(ulong)IVar3);
        local_40 = (TwoStageDynamicBayesianNetwork *)((double)pTVar10 * (double)local_40);
        pTVar2 = local_40;
        in_stack_fffffffffffffea0 = pTVar10;
        in_stack_ffffffffffffff48 = pTVar10;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffeb0)
        ;
        pTVar10 = pTVar2;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffeb0)
        ;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffeb0)
        ;
        local_44 = local_44 + 1;
      }
      return (double)local_40;
    }
  }
  uVar6 = __cxa_allocate_exception(0x28);
  E::E(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  __cxa_throw(uVar6,&E::typeinfo,E::~E);
}

Assistant:

double TwoStageDynamicBayesianNetwork::
GetYProbability( const vector<Index>& X,
                    const vector<Index>& A,
                    const vector<Index>& Y) const
{
    size_t nrSF = _m_madp->GetNrStateFactors();
    if(Y.size() != nrSF || X.size() != nrSF)
        throw E("TwoStageDynamicBayesianNetwork::GetYProbability only implemented for full state vectors");
    if(A.size() != _m_madp->GetNrAgents())
        throw E("TwoStageDynamicBayesianNetwork::GetYProbability only implemented for full joint actions");
    
    double p = 1.0;
    for(Index y=0; y < Y.size(); y++)
    {
        vector<Index> X_restr(GetXSoI_Y(y).size());
        IndexTools::RestrictIndividualIndicesToScope(X, GetXSoI_Y(y), X_restr );
        vector<Index> A_restr(GetASoI_Y(y).size());
        IndexTools::RestrictIndividualIndicesToScope(A, GetASoI_Y(y), A_restr );
        vector<Index> Y_restr(GetYSoI_Y(y).size());
        IndexTools::RestrictIndividualIndicesToScope(Y, GetYSoI_Y(y), Y_restr );
        Index iiI = IndividualToJointYiiIndices(y, X_restr, A_restr, Y_restr);
        Index yVal = Y[y];
        double p_y = _m_Y_CPDs[y]->Get(yVal, iiI);  
        p *= p_y;
    }
    return(p);
}